

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall
Graph<std::pair<double,_double>_>::clearGraph(Graph<std::pair<double,_double>_> *this)

{
  pointer ppVVar1;
  Vertex<std::pair<double,_double>_> *pVVar2;
  pointer ppEVar3;
  vector<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
  *__range1;
  pointer ppEVar4;
  pointer ppVVar5;
  
  ppVVar1 = (this->vertexSet).
            super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVVar5 = (this->vertexSet).
                 super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVVar5 != ppVVar1;
      ppVVar5 = ppVVar5 + 1) {
    pVVar2 = *ppVVar5;
    ppEVar3 = (pVVar2->outgoing).
              super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppEVar4 = (pVVar2->outgoing).
                   super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppEVar4 != ppEVar3;
        ppEVar4 = ppEVar4 + 1) {
      if (*ppEVar4 != (Edge<std::pair<double,_double>_> *)0x0) {
        operator_delete(*ppEVar4,0x18);
      }
    }
    if (pVVar2 != (Vertex<std::pair<double,_double>_> *)0x0) {
      ppEVar4 = (pVVar2->incoming).
                super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppEVar4 != (pointer)0x0) {
        operator_delete(ppEVar4,(long)(pVVar2->incoming).
                                      super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppEVar4);
      }
      ppEVar4 = (pVVar2->outgoing).
                super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppEVar4 != (pointer)0x0) {
        operator_delete(ppEVar4,(long)(pVVar2->outgoing).
                                      super__Vector_base<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppEVar4);
      }
      operator_delete(pVVar2,0x88);
    }
  }
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->vertexMap)._M_h);
  (this->maxCoords).first = 0.0;
  (this->maxCoords).second = 0.0;
  (this->minCoords).first = 0.0;
  (this->minCoords).second = 0.0;
  return;
}

Assistant:

void Graph<T>::clearGraph() {
    for (auto vertex : vertexSet) {
        for (auto edge : vertex->outgoing) {
            delete edge;
        }
        delete vertex;
    }
    vertexMap.clear();
    minCoords = make_pair(0,0);
    maxCoords = make_pair(0,0);
}